

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O0

int lws_buflist_append_segment(lws_buflist **head,uint8_t *buf,size_t len)

{
  undefined8 *puVar1;
  int local_44;
  int sanity;
  void *p;
  int first;
  lws_buflist *nbuf;
  size_t len_local;
  uint8_t *buf_local;
  lws_buflist **head_local;
  
  head_local._4_4_ = (uint)((*head != (lws_buflist *)0x0 ^ 0xffU) & 1);
  local_44 = 0x400;
  if (buf == (uint8_t *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/buflist.c"
                  ,0x2a,
                  "int lws_buflist_append_segment(struct lws_buflist **, const uint8_t *, size_t)");
  }
  buf_local = (uint8_t *)head;
  if (len != 0) {
    while( true ) {
      if (*(long *)buf_local == 0) {
        _lws_log(8,"%s: len %u first %d %p\n","lws_buflist_append_segment",len & 0xffffffff,
                 (ulong)head_local._4_4_,*head);
        puVar1 = (undefined8 *)lws_realloc((void *)0x0,len + 0x29,"lws_buflist_append_segment");
        if (puVar1 == (undefined8 *)0x0) {
          _lws_log(1,"%s: OOM\n","lws_buflist_append_segment");
          head_local._4_4_ = 0xffffffff;
        }
        else {
          puVar1[1] = len;
          puVar1[2] = 0;
          *puVar1 = 0;
          memcpy(puVar1 + 5,buf,len);
          *(undefined8 **)buf_local = puVar1;
        }
        return head_local._4_4_;
      }
      local_44 = local_44 + -1;
      if (local_44 == 0) break;
      if (*(long *)buf_local == **(long **)buf_local) {
        _lws_log(1,"%s: corrupt list points to self\n","lws_buflist_append_segment");
        return -1;
      }
      buf_local = *(uint8_t **)buf_local;
    }
    _lws_log(1,"%s: buflist reached sanity limit\n","lws_buflist_append_segment");
    return -1;
  }
  __assert_fail("len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/buflist.c"
                ,0x2b,
                "int lws_buflist_append_segment(struct lws_buflist **, const uint8_t *, size_t)");
}

Assistant:

int
lws_buflist_append_segment(struct lws_buflist **head, const uint8_t *buf,
			   size_t len)
{
	struct lws_buflist *nbuf;
	int first = !*head;
	void *p = *head;
	int sanity = 1024;

	assert(buf);
	assert(len);

	/* append at the tail */
	while (*head) {
		if (!--sanity) {
			lwsl_err("%s: buflist reached sanity limit\n", __func__);
			return -1;
		}
		if (*head == (*head)->next) {
			lwsl_err("%s: corrupt list points to self\n", __func__);
			return -1;
		}
		head = &((*head)->next);
	}

	(void)p;
	lwsl_info("%s: len %u first %d %p\n", __func__, (unsigned int)len,
					      first, p);

	nbuf = (struct lws_buflist *)lws_malloc(sizeof(struct lws_buflist) +
						len + LWS_PRE + 1, __func__);
	if (!nbuf) {
		lwsl_err("%s: OOM\n", __func__);
		return -1;
	}

	nbuf->len = len;
	nbuf->pos = 0;
	nbuf->next = NULL;

	/* whoever consumes this might need LWS_PRE from the start... */
	p = (uint8_t *)nbuf + sizeof(*nbuf) + LWS_PRE;
	memcpy(p, buf, len);

	*head = nbuf;

	return first; /* returns 1 if first segment just created */
}